

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O1

void decompose(double *x,int N,int f,double *filter,char *type,double *trend,int *ltrend,
              double *seas,int *lseas,double *random,int *lrandom)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  double *inp2;
  ulong uVar6;
  double *oup;
  void *__ptr;
  void *__s;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  size_t __size;
  ulong uVar12;
  int iVar13;
  void *pvVar14;
  uint uVar15;
  double dVar16;
  
  uVar5 = (ulong)f;
  uVar9 = (ulong)(uint)f;
  inp2 = filter;
  if ((filter == (double *)0x0) && (inp2 = (double *)malloc(uVar5 * 8), 0 < f)) {
    uVar6 = 0;
    do {
      inp2[uVar6] = 1.0 / (double)f;
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
  }
  iVar2 = strcmp(type,"additive");
  if ((iVar2 == 0) && (iVar2 = strcmp(type,"multiplicative"), iVar2 == 0)) {
    puts("Type takes only either additive or multiplicative values ");
    exit(-1);
  }
  uVar3 = (int)(((uint)(uVar5 >> 0x1f) & 1) + f) >> 1;
  iVar2 = N - f;
  oup = (double *)malloc((long)iVar2 * 8 + 8);
  convolve("valid","direct",x,N,inp2,f,oup);
  uVar15 = iVar2 + (f & 1U);
  __size = (long)(int)uVar15 * 8;
  __ptr = malloc(__size);
  __s = malloc(uVar5 * 8);
  iVar4 = strcmp(type,"multiplicative");
  if (iVar4 == 0) {
    if (0 < (int)uVar15) {
      lVar10 = 0;
      do {
        *(double *)((long)__ptr + lVar10 * 8) = x[(int)uVar3 + lVar10] / oup[lVar10];
        lVar7 = (int)uVar3 + lVar10;
        lVar10 = lVar10 + 1;
      } while (lVar7 + 1 < (long)(int)(uVar15 + uVar3));
    }
  }
  else {
    iVar4 = strcmp(type,"additive");
    if (0 < (int)uVar15 && iVar4 == 0) {
      lVar10 = 0;
      do {
        *(double *)((long)__ptr + lVar10 * 8) = x[(int)uVar3 + lVar10] - oup[lVar10];
        lVar7 = (int)uVar3 + lVar10;
        lVar10 = lVar10 + 1;
      } while (lVar7 + 1 < (long)(int)(uVar15 + uVar3));
    }
  }
  dVar16 = ceil((double)(int)uVar15 / (double)f);
  iVar4 = (int)dVar16;
  if (0 < f) {
    memset(__s,0,uVar9 * 8);
  }
  uVar1 = iVar4 - 1;
  if (1 < iVar4) {
    uVar6 = 0;
    pvVar14 = __ptr;
    do {
      if (0 < f) {
        uVar12 = 0;
        do {
          *(double *)((long)__s + uVar12 * 8) =
               *(double *)((long)pvVar14 + uVar12 * 8) + *(double *)((long)__s + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      uVar6 = uVar6 + 1;
      pvVar14 = (void *)((long)pvVar14 + uVar9 * 8);
    } while (uVar6 != uVar1);
  }
  iVar13 = uVar1 * f;
  uVar11 = uVar15 - iVar13;
  if (uVar11 != 0 && iVar13 <= (int)uVar15) {
    uVar6 = 0;
    do {
      *(double *)((long)__s + uVar6 * 8) =
           (*(double *)((long)__ptr + uVar6 * 8 + (long)iVar13 * 8) +
           *(double *)((long)__s + uVar6 * 8)) / (double)iVar4;
      uVar6 = uVar6 + 1;
    } while (uVar11 != uVar6);
  }
  if ((int)uVar11 < f) {
    lVar10 = __size + (long)iVar13 * -8;
    lVar7 = 0;
    do {
      *(double *)((long)__s + lVar7 * 8 + lVar10) =
           *(double *)((long)__s + lVar7 * 8 + lVar10) / (double)(int)uVar1;
      lVar7 = lVar7 + 1;
    } while (((f & 0xfffffffeU) + iVar4 * f) - N != (int)lVar7);
  }
  if (f - uVar3 != 0 && (int)uVar3 <= f) {
    memcpy(seas,(void *)((long)__s + (long)(int)uVar3 * 8),(ulong)(~uVar3 + f) * 8 + 8);
  }
  if (1 < f) {
    lVar10 = 0;
    do {
      seas[(uVar5 + lVar10) - (long)(int)uVar3] = *(double *)((long)__s + (long)(int)lVar10 * 8);
      lVar7 = (int)(f - uVar3) + lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar7 + 1 < (long)uVar9);
  }
  if (1 < (int)uVar1) {
    pdVar8 = seas + uVar9;
    uVar5 = 1;
    do {
      if (0 < f) {
        uVar6 = 0;
        do {
          pdVar8[uVar6] = seas[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
      uVar5 = uVar5 + 1;
      pdVar8 = pdVar8 + uVar9;
    } while (uVar5 != uVar1);
  }
  if (iVar13 < (int)uVar11) {
    pdVar8 = seas;
    lVar10 = (long)iVar13;
    do {
      pdVar8[iVar13] = *pdVar8;
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar10 < (int)uVar11);
  }
  iVar4 = uVar15 - 1;
  if ((f & 1U) == 0) {
    iVar4 = iVar2;
  }
  *lseas = iVar4;
  *lrandom = iVar4;
  memcpy(trend,oup,__size);
  *ltrend = uVar15;
  iVar2 = strcmp(type,"multiplicative");
  if (iVar2 == 0) {
    if (0 < (int)uVar15) {
      lVar10 = 0;
      do {
        random[lVar10] = x[(int)uVar3 + lVar10] / trend[lVar10];
        lVar7 = (int)uVar3 + lVar10;
        lVar10 = lVar10 + 1;
      } while (lVar7 + 1 < (long)(int)(uVar3 + uVar15));
    }
    if (0 < (int)uVar15) {
      uVar5 = 0;
      do {
        random[uVar5] = random[uVar5] / seas[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar15 != uVar5);
    }
  }
  else {
    iVar2 = strcmp(type,"additive");
    if (iVar2 == 0) {
      if (0 < (int)uVar15) {
        lVar10 = 0;
        do {
          random[lVar10] = x[(int)uVar3 + lVar10] - trend[lVar10];
          lVar7 = (int)uVar3 + lVar10;
          lVar10 = lVar10 + 1;
        } while (lVar7 + 1 < (long)(int)(uVar3 + uVar15));
      }
      if (0 < (int)uVar15) {
        uVar5 = 0;
        do {
          random[uVar5] = random[uVar5] - seas[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar15 != uVar5);
      }
    }
  }
  if (filter == (double *)0x0) {
    free(inp2);
  }
  free(oup);
  free(__ptr);
  free(__s);
  return;
}

Assistant:

void decompose(double *x,int N, int f,double *filter, const char *type, double *trend, int *ltrend, double *seas, int *lseas, double *random, int *lrandom) {
    int isOdd,i,j,f2,clen,batches;
    double *filt,*cout,*detrend,*seasonalmeans;


    isOdd = f%2;

    if (filter == NULL) {
        filt = (double*) malloc(sizeof(double) * f);
        for(i = 0; i < f;++i) {
            filt[i] = 1.0 / (double) f;
        }
    } else {
        filt = &filter[0];
    }

    if (!(strcmp(type,"additive") || strcmp(type,"multiplicative"))) {
        printf("Type takes only either additive or multiplicative values \n");
        exit(-1);
    }

    f2 = f / 2;
    clen = N - f + 1;

    cout = (double*) malloc(sizeof(double) * clen);

    convolve("valid","direct",x,N,filt,f,cout);

    //mdisplay(cout,1,clen);

    if (!isOdd) {
        clen--;
    }

    detrend = (double*) malloc(sizeof(double) * clen);
    seasonalmeans = (double*) malloc(sizeof(double) * f);

    if (!strcmp(type,"multiplicative")) {
        for(i = f2; i < clen + f2;++i) {
            detrend[i-f2] = x[i] / cout[i-f2];
        }
    } else if (!strcmp(type,"additive")) {
        for(i = f2; i < clen + f2;++i) {
            detrend[i-f2] = x[i] - cout[i-f2];
        }
    }

    //mdisplay(detrend,1,clen);

    findMeans(detrend,clen,f,seasonalmeans);

    for(i = 0; i < f-f2;++i) {
        seas[i] = seasonalmeans[f2+i];
    }

    for(i = f-f2; i < f;++i) {
        seas[i] = seasonalmeans[i-f+f2];
    }

    batches = ceil((double) clen / (double) f);

    for(i = 1; i < batches-1;++i) {
        for(j = 0; j < f;++j) {
            seas[i*f+j] =seas[j];
        }
    }
    j = 0;
    for( i = f*(batches-1); i < clen - f*(batches-1);++i) {
        seas[i] = seas[j];
        j++;
    }

    if (isOdd) {
        *lseas = clen - 1;
        *lrandom = clen - 1;
    } else {
        *lseas = clen;
        *lrandom = clen;
    }

    memcpy(trend,cout,sizeof(double)*clen);
    *ltrend = clen;

    if (!strcmp(type,"multiplicative")) {
        for(i = f2; i < clen + f2;++i) {
            random[i-f2] = x[i] / trend[i-f2];
        }
        for(i = 0; i < clen;++i) {
            random[i] = random[i] /seas[i];
        }
    } else if (!strcmp(type,"additive")) {
        for(i = f2; i < clen + f2;++i) {
            random[i-f2] = x[i] - trend[i-f2];
        }
        for(i = 0; i < clen;++i) {
            random[i] = random[i] - seas[i];
        }
    }


    if (filter == NULL) {
        free(filt);
    }

    free(cout);
    free(detrend);
    free(seasonalmeans);
}